

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O0

int mk_plugin_sched_remove_client(int socket,mk_server *server)

{
  mk_sched_worker *sched_00;
  mk_sched_conn *conn_00;
  mk_sched_worker *sched;
  mk_sched_conn *conn;
  mk_server *server_local;
  int socket_local;
  
  sched_00 = mk_sched_get_thread_conf();
  conn_00 = mk_sched_get_connection(sched_00,socket);
  if (conn_00 == (mk_sched_conn *)0x0) {
    server_local._4_4_ = -1;
  }
  else {
    server_local._4_4_ = mk_sched_remove_client(conn_00,sched_00,server);
  }
  return server_local._4_4_;
}

Assistant:

int mk_plugin_sched_remove_client(int socket, struct mk_server *server)
{
    struct mk_sched_conn *conn;
    struct mk_sched_worker *sched;

    MK_TRACE("[FD %i] remove client", socket);

    sched = mk_sched_get_thread_conf();
    conn  = mk_sched_get_connection(sched, socket);
    if (!conn) {
        return -1;
    }

    return mk_sched_remove_client(conn, sched, server);
}